

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yolov3detectionoutput.cpp
# Opt level: O2

void ncnn::qsort_descent_inplace<ncnn::BBoxRect>
               (vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_> *datas,
               vector<float,_std::allocator<float>_> *scores,int left,int right)

{
  float fVar1;
  float fVar2;
  int iVar3;
  pointer pBVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  long lVar8;
  long lVar9;
  int iVar10;
  int iVar11;
  long lVar12;
  int iVar13;
  pointer pfVar14;
  long lVar15;
  int iVar16;
  int iVar17;
  long lVar18;
  long lVar19;
  
  pfVar14 = (scores->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
            super__Vector_impl_data._M_start;
  do {
    fVar1 = pfVar14[(left + right) / 2];
    iVar13 = left;
    iVar3 = right;
    while (iVar13 <= iVar3) {
      lVar12 = (long)iVar13 + -1;
      lVar19 = (long)iVar13 * 5 + -5;
      do {
        iVar10 = iVar13;
        lVar15 = lVar19;
        iVar11 = iVar10 + 1;
        lVar9 = lVar12 + 1;
        lVar12 = lVar12 + 1;
        lVar19 = lVar15 + 5;
        iVar13 = iVar11;
      } while (fVar1 < pfVar14[lVar9]);
      lVar19 = (long)iVar3 + 1;
      lVar9 = (long)iVar3 * 5 + 5;
      do {
        iVar16 = iVar3;
        lVar18 = lVar9;
        iVar17 = iVar16 + -1;
        lVar8 = lVar19 + -1;
        lVar19 = lVar19 + -1;
        lVar9 = lVar18 + -5;
        iVar3 = iVar17;
      } while (pfVar14[lVar8] <= fVar1 && fVar1 != pfVar14[lVar8]);
      iVar13 = iVar10;
      iVar3 = iVar16;
      if (lVar12 <= lVar19) {
        pBVar4 = (datas->super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>).
                 _M_impl.super__Vector_impl_data._M_start;
        iVar3 = (&pBVar4[1].label)[lVar15];
        uVar5 = *(undefined8 *)(&pBVar4[1].xmin + lVar15);
        uVar6 = *(undefined8 *)(&pBVar4[1].xmin + lVar15 + 2);
        (&pBVar4[1].label)[lVar15] = (&pBVar4[-1].label)[lVar18];
        uVar7 = *(undefined8 *)(&pBVar4[-1].xmin + lVar18 + 2);
        *(undefined8 *)(&pBVar4[1].xmin + lVar15) = *(undefined8 *)(&pBVar4[-1].xmin + lVar18);
        *(undefined8 *)(&pBVar4[1].xmin + lVar15 + 2) = uVar7;
        (&pBVar4[-1].label)[lVar18] = iVar3;
        *(undefined8 *)(&pBVar4[-1].xmin + lVar18) = uVar5;
        *(undefined8 *)(&pBVar4[-1].xmin + lVar18 + 2) = uVar6;
        pfVar14 = (scores->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                  super__Vector_impl_data._M_start;
        fVar2 = pfVar14[lVar12];
        pfVar14[lVar12] = pfVar14[lVar19];
        pfVar14[lVar19] = fVar2;
        iVar13 = iVar11;
        iVar3 = iVar17;
      }
    }
    if (left < iVar3) {
      qsort_descent_inplace<ncnn::BBoxRect>(datas,scores,left,iVar3);
      pfVar14 = (scores->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                super__Vector_impl_data._M_start;
    }
    left = iVar13;
  } while (iVar13 < right);
  return;
}

Assistant:

static void qsort_descent_inplace(std::vector<T>& datas, std::vector<float>& scores, int left, int right)
{
    int i = left;
    int j = right;
    float p = scores[(left + right) / 2];

    while (i <= j)
    {
        while (scores[i] > p)
            i++;

        while (scores[j] < p)
            j--;

        if (i <= j)
        {
            // swap
            std::swap(datas[i], datas[j]);
            std::swap(scores[i], scores[j]);

            i++;
            j--;
        }
    }

    if (left < j)
        qsort_descent_inplace(datas, scores, left, j);

    if (i < right)
        qsort_descent_inplace(datas, scores, i, right);
}